

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

char * execution_model_to_str(ExecutionModel model)

{
  char *pcStack_10;
  ExecutionModel model_local;
  
  if (model == ExecutionModelVertex) {
    pcStack_10 = "vertex";
  }
  else if (model == ExecutionModelTessellationControl) {
    pcStack_10 = "tessellation control";
  }
  else if (model == ExecutionModelTessellationEvaluation) {
    pcStack_10 = "tessellation evaluation";
  }
  else if (model == ExecutionModelGeometry) {
    pcStack_10 = "geometry";
  }
  else if (model == ExecutionModelFragment) {
    pcStack_10 = "fragment";
  }
  else if (model == ExecutionModelGLCompute) {
    pcStack_10 = "compute";
  }
  else if (model == ExecutionModelRayGenerationKHR) {
    pcStack_10 = "raygenNV";
  }
  else if (model == ExecutionModelIntersectionKHR) {
    pcStack_10 = "intersectionNV";
  }
  else if (model == ExecutionModelAnyHitKHR) {
    pcStack_10 = "anyhitNV";
  }
  else if (model == ExecutionModelClosestHitKHR) {
    pcStack_10 = "closesthitNV";
  }
  else if (model == ExecutionModelMissKHR) {
    pcStack_10 = "missNV";
  }
  else if (model == ExecutionModelCallableKHR) {
    pcStack_10 = "callableNV";
  }
  else {
    pcStack_10 = "???";
  }
  return pcStack_10;
}

Assistant:

static const char *execution_model_to_str(spv::ExecutionModel model)
{
	switch (model)
	{
	case spv::ExecutionModelVertex:
		return "vertex";
	case spv::ExecutionModelTessellationControl:
		return "tessellation control";
	case ExecutionModelTessellationEvaluation:
		return "tessellation evaluation";
	case ExecutionModelGeometry:
		return "geometry";
	case ExecutionModelFragment:
		return "fragment";
	case ExecutionModelGLCompute:
		return "compute";
	case ExecutionModelRayGenerationNV:
		return "raygenNV";
	case ExecutionModelIntersectionNV:
		return "intersectionNV";
	case ExecutionModelCallableNV:
		return "callableNV";
	case ExecutionModelAnyHitNV:
		return "anyhitNV";
	case ExecutionModelClosestHitNV:
		return "closesthitNV";
	case ExecutionModelMissNV:
		return "missNV";
	default:
		return "???";
	}
}